

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

gpointer g_hash_table_find(GHashTable *hash_table,GHRFunc predicate,gpointer user_data)

{
  gboolean gVar1;
  GHashNode *pGVar2;
  GHashNode *node;
  gint i;
  gpointer user_data_local;
  GHRFunc predicate_local;
  GHashTable *hash_table_local;
  
  if ((hash_table != (GHashTable *)0x0) && (predicate != (GHRFunc)0x0)) {
    for (node._4_4_ = 0; node._4_4_ < hash_table->size; node._4_4_ = node._4_4_ + 1) {
      pGVar2 = hash_table->nodes + node._4_4_;
      if ((1 < pGVar2->key_hash) &&
         (gVar1 = (*predicate)(pGVar2->key,pGVar2->value,user_data), gVar1 != 0)) {
        return pGVar2->value;
      }
    }
  }
  return (gpointer)0x0;
}

Assistant:

gpointer g_hash_table_find (GHashTable      *hash_table,
        GHRFunc          predicate,
        gpointer         user_data)
{
    gint i;

    if (hash_table == NULL) return NULL;
    if (predicate == NULL) return NULL;

    for (i = 0; i < hash_table->size; i++)
    {
        GHashNode *node = &hash_table->nodes [i];

        if (node->key_hash > 1 && predicate (node->key, node->value, user_data))
            return node->value;
    }

    return NULL;
}